

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<Fad<float>_>::Resize(TPZVec<Fad<float>_> *this,int64_t newsize)

{
  undefined4 *puVar1;
  Fad<float> *pFVar2;
  void *pvVar3;
  ostream *poVar4;
  int64_t *piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  Vector<float> *this_00;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar7 = this->fNElements;
  if (lVar7 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<float> *)0x0) {
        lVar7 = *(long *)&pFVar2[-1].defaultVal;
        if (lVar7 != 0) {
          lVar8 = lVar7 << 5;
          do {
            pvVar3 = *(void **)((long)pFVar2 + lVar8 + -0x10);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            *(undefined4 *)((long)pFVar2 + lVar8 + -0x18) = 0;
            *(undefined8 *)((long)pFVar2 + lVar8 + -0x10) = 0;
            lVar8 = lVar8 + -0x20;
          } while (lVar8 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar7 << 5 | 8);
      }
      this->fStore = (Fad<float> *)0x0;
    }
    else {
      piVar5 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize << 5 | 8);
      *piVar5 = newsize;
      uVar6 = 0;
      do {
        *(undefined4 *)((long)piVar5 + uVar6 + 8) = 0;
        *(undefined4 *)((long)piVar5 + uVar6 + 0x10) = 0;
        *(undefined8 *)((long)piVar5 + uVar6 + 0x18) = 0;
        *(undefined4 *)((long)piVar5 + uVar6 + 0x20) = 0;
        uVar6 = uVar6 + 0x20;
      } while (newsize << 5 != uVar6);
      if (newsize <= lVar7) {
        lVar7 = newsize;
      }
      if (0 < lVar7) {
        this_00 = (Vector<float> *)(piVar5 + 2);
        lVar8 = 0;
        do {
          puVar1 = (undefined4 *)((long)&this->fStore->val_ + lVar8);
          *(undefined4 *)&this_00[-1].ptr_to_data = *puVar1;
          Vector<float>::operator=(this_00,(Vector<float> *)(puVar1 + 2));
          this_00[1].num_elts = puVar1[6];
          this_00 = this_00 + 2;
          lVar8 = lVar8 + 0x20;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<float> *)0x0) {
        lVar7 = *(long *)&pFVar2[-1].defaultVal;
        if (lVar7 != 0) {
          lVar8 = lVar7 << 5;
          do {
            pvVar3 = *(void **)((long)pFVar2 + lVar8 + -0x10);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            *(undefined4 *)((long)pFVar2 + lVar8 + -0x18) = 0;
            *(undefined8 *)((long)pFVar2 + lVar8 + -0x10) = 0;
            lVar8 = lVar8 + -0x20;
          } while (lVar8 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar7 << 5 | 8);
      }
      this->fStore = (Fad<float> *)(piVar5 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}